

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DylibBundler.cpp
# Opt level: O2

void addDependency(string *path,string *filename)

{
  bool bVar1;
  ulong uVar2;
  mapped_type *pmVar3;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  byte bVar7;
  vector<Dependency,_std::allocator<Dependency>_> deps_in_file;
  string local_e8;
  string local_c8;
  Dependency dep;
  
  std::__cxx11::string::string((string *)&local_c8,(string *)path);
  Dependency::Dependency(&dep,&local_c8,filename);
  std::__cxx11::string::~string((string *)&local_c8);
  uVar2 = ((long)deps.super__Vector_base<Dependency,_std::allocator<Dependency>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)deps.super__Vector_base<Dependency,_std::allocator<Dependency>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x78;
  uVar6 = 0;
  uVar4 = uVar2 & 0xffffffff;
  if ((int)uVar2 < 1) {
    uVar4 = uVar6;
  }
  bVar7 = 0;
  for (; uVar4 * 0x78 - uVar6 != 0; uVar6 = uVar6 + 0x78) {
    bVar1 = Dependency::mergeIfSameAs
                      (&dep,(Dependency *)
                            ((long)&((deps.
                                      super__Vector_base<Dependency,_std::allocator<Dependency>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->filename).
                                    _M_dataplus._M_p + uVar6));
    bVar7 = bVar7 | bVar1;
  }
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Dependency,_std::allocator<Dependency>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Dependency,_std::allocator<Dependency>_>_>_>_>
           ::operator[](&deps_per_file_abi_cxx11_,filename);
  std::vector<Dependency,_std::allocator<Dependency>_>::vector(&deps_in_file,pmVar3);
  uVar2 = ((long)deps_in_file.super__Vector_base<Dependency,_std::allocator<Dependency>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)deps_in_file.super__Vector_base<Dependency,_std::allocator<Dependency>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x78;
  uVar6 = 0;
  uVar4 = uVar2 & 0xffffffff;
  if ((int)uVar2 < 1) {
    uVar4 = uVar6;
  }
  bVar5 = 0;
  for (; uVar4 * 0x78 - uVar6 != 0; uVar6 = uVar6 + 0x78) {
    bVar1 = Dependency::mergeIfSameAs
                      (&dep,(Dependency *)
                            ((long)&((deps_in_file.
                                      super__Vector_base<Dependency,_std::allocator<Dependency>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->filename).
                                    _M_dataplus._M_p + uVar6));
    bVar5 = bVar5 | bVar1;
  }
  std::__cxx11::string::string((string *)&local_e8,(string *)&dep.prefix);
  bVar1 = Settings::isPrefixBundled(&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  if (bVar1) {
    if (bVar7 == 0) {
      std::vector<Dependency,_std::allocator<Dependency>_>::push_back(&deps,&dep);
    }
    if (bVar5 == 0) {
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Dependency,_std::allocator<Dependency>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Dependency,_std::allocator<Dependency>_>_>_>_>
               ::operator[](&deps_per_file_abi_cxx11_,filename);
      std::vector<Dependency,_std::allocator<Dependency>_>::push_back(pmVar3,&dep);
    }
  }
  std::vector<Dependency,_std::allocator<Dependency>_>::~vector(&deps_in_file);
  Dependency::~Dependency(&dep);
  return;
}

Assistant:

void addDependency(const std::string& path, const std::string& filename)
{
    Dependency dep(path, filename);
    
    // we need to check if this library was already added to avoid duplicates
    bool in_deps = false;
    const int dep_amount = deps.size();
    for(int n=0; n<dep_amount; n++)
    {
        if(dep.mergeIfSameAs(deps[n])) in_deps = true;
    }
    
    // check if this library was already added to |deps_per_file[filename]| to avoid duplicates
    std::vector<Dependency> deps_in_file = deps_per_file[filename];
    bool in_deps_per_file = false;
    const int deps_in_file_amount = deps_in_file.size();
    for(int n=0; n<deps_in_file_amount; n++)
    {
        if(dep.mergeIfSameAs(deps_in_file[n])) in_deps_per_file = true;
    }

    if(!Settings::isPrefixBundled(dep.getPrefix())) return;
    
    if(!in_deps) deps.push_back(dep);
    if(!in_deps_per_file) deps_per_file[filename].push_back(dep);
}